

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clocks.cc
# Opt level: O0

void tchecker::from_string(clock_constraint_container_t *c,clock_variables_t *clocks,string *str)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *localvars;
  bool bVar1;
  element_type *peVar2;
  invalid_argument *piVar3;
  element_type *expr_00;
  element_type *peVar4;
  element_type *peVar5;
  undefined1 local_1a0 [8];
  clock_constraints_visitor_t v;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  anon_class_1_0_00000001 local_161;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_160;
  undefined1 local_140 [8];
  shared_ptr<tchecker::typed_expression_t> typed_expr;
  integer_variables_t no_integer_variables;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  allocator<char> local_51;
  string local_50;
  undefined1 local_30 [8];
  shared_ptr<tchecker::expression_t> expr;
  string *str_local;
  clock_variables_t *clocks_local;
  clock_constraint_container_t *c_local;
  
  expr.super___shared_ptr<tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)str;
  bVar1 = std::operator==(str,"");
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_51);
    parsing::parse_expression
              ((parsing *)local_30,&local_50,
               (string *)
               expr.super___shared_ptr<tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
    peVar2 = std::__shared_ptr<tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2> *)local_30
                       );
    if (peVar2 == (element_type *)0x0) {
      piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::operator+(&local_88,"syntax error in ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     expr.super___shared_ptr<tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
      std::invalid_argument::invalid_argument(piVar3,(string *)&local_88);
      __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    integer_variables_t::integer_variables_t
              ((integer_variables_t *)
               &typed_expr.
                super___shared_ptr<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    expr_00 = std::
              __shared_ptr_access<tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_30);
    std::function<void(std::__cxx11::string_const&)>::
    function<tchecker::from_string(std::vector<tchecker::clock_constraint_t,std::allocator<tchecker::clock_constraint_t>>&,tchecker::clock_variables_t_const&,std::__cxx11::string_const&)::__0,void>
              ((function<void(std::__cxx11::string_const&)> *)&local_160,&local_161);
    localvars = &typed_expr.
                 super___shared_ptr<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount;
    typecheck((tchecker *)local_140,expr_00,(integer_variables_t *)localvars,
              (integer_variables_t *)localvars,clocks,&local_160);
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function(&local_160);
    peVar4 = std::__shared_ptr<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2> *)
                        local_140);
    if (peVar4 == (element_type *)0x0) {
      v._c._7_1_ = 1;
      piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::operator+(&local_188,"type error in expression ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     expr.super___shared_ptr<tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
      std::invalid_argument::invalid_argument(piVar3,(string *)&local_188);
      v._c._7_1_ = 0;
      __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    clock_constraints_visitor_t::clock_constraints_visitor_t
              ((clock_constraints_visitor_t *)local_1a0,c);
    peVar5 = std::
             __shared_ptr_access<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_140);
    (**(code **)(*(long *)peVar5 + 0x30))(peVar5,local_1a0);
    clock_constraints_visitor_t::~clock_constraints_visitor_t
              ((clock_constraints_visitor_t *)local_1a0);
    std::shared_ptr<tchecker::typed_expression_t>::~shared_ptr
              ((shared_ptr<tchecker::typed_expression_t> *)local_140);
    integer_variables_t::~integer_variables_t
              ((integer_variables_t *)
               &typed_expr.
                super___shared_ptr<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::shared_ptr<tchecker::expression_t>::~shared_ptr
              ((shared_ptr<tchecker::expression_t> *)local_30);
  }
  return;
}

Assistant:

void from_string(tchecker::clock_constraint_container_t & c, tchecker::clock_variables_t const & clocks,
                 std::string const & str)
{
  if (str == "")
    return;

  // parse str as a typed expression
  std::shared_ptr<tchecker::expression_t> expr{tchecker::parsing::parse_expression("", str)};
  if (expr.get() == nullptr)
    throw std::invalid_argument("syntax error in " + str);

  tchecker::integer_variables_t no_integer_variables;
  std::shared_ptr<tchecker::typed_expression_t> typed_expr{
      tchecker::typecheck(*expr, no_integer_variables, no_integer_variables, clocks,
                          [](std::string const & err) { std::cerr << tchecker::log_error << err << std::endl; })};
  if (typed_expr.get() == nullptr)
    throw std::invalid_argument("type error in expression " + str);

  // instantiate a typed expression visitor, add each clock constraint from expression to c
  try {
    tchecker::clock_constraints_visitor_t v(c);
    typed_expr->visit(v);
  }
  catch (...) {
    throw std::invalid_argument("error in " + str);
  }
}